

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O3

ByteData256 * __thiscall
cfd::core::TapBranch::GetBaseHash(ByteData256 *__return_storage_ptr__,TapBranch *this)

{
  int iVar1;
  HashUtil *pHVar2;
  undefined1 local_88 [40];
  ByteData local_60;
  ByteData local_48;
  ByteData local_30;
  
  if (this->has_leaf_ == false) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               &(this->root_commitment_).data_);
  }
  else {
    if (GetBaseHash()::kTaggedHash == '\0') {
      iVar1 = __cxa_guard_acquire(&GetBaseHash()::kTaggedHash);
      if (iVar1 != 0) {
        local_88._0_8_ = local_88 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"TapLeaf","");
        HashUtil::Sha256(&GetBaseHash::kTaggedHash,(string *)local_88);
        if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
          operator_delete((void *)local_88._0_8_);
        }
        __cxa_atexit(ByteData256::~ByteData256,&GetBaseHash::kTaggedHash,&__dso_handle);
        __cxa_guard_release(&GetBaseHash()::kTaggedHash);
      }
    }
    HashUtil::HashUtil((HashUtil *)local_88,'\x03');
    pHVar2 = HashUtil::operator<<((HashUtil *)local_88,&GetBaseHash::kTaggedHash);
    pHVar2 = HashUtil::operator<<(pHVar2,&GetBaseHash::kTaggedHash);
    ByteData::ByteData(&local_30,this->leaf_version_);
    pHVar2 = HashUtil::operator<<(pHVar2,&local_30);
    Script::GetData(&local_60,&this->script_);
    ByteData::Serialize(&local_48,&local_60);
    pHVar2 = HashUtil::operator<<(pHVar2,&local_48);
    HashUtil::Output256(__return_storage_ptr__,pHVar2);
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_88._0_8_ = &PTR__HashUtil_002598d8;
    if ((void *)local_88._16_8_ != (void *)0x0) {
      operator_delete((void *)local_88._16_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 TapBranch::GetBaseHash() const {
  if (!has_leaf_) return root_commitment_;

  static auto kTaggedHash = HashUtil::Sha256("TapLeaf");
  return (HashUtil(HashUtil::kSha256)
          << kTaggedHash << kTaggedHash << ByteData(leaf_version_)
          << script_.GetData().Serialize())
      .Output256();
}